

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O2

void phmap::priv::
     Deallocate<8ul,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
               (allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>
                *alloc,void *p,size_t n)

{
  unsigned_long uVar1;
  rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>
  *prVar2;
  rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>
  *addr;
  rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>
  *prVar3;
  offset_ptr_internal<unsigned_long,_0UL> local_10;
  A mem_alloc;
  
  if (n != 0) {
    uVar1 = (alloc->mp_mngr).internal.m_offset;
    prVar3 = (rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>
              *)0x0;
    prVar2 = (rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>
              *)((long)&(alloc->mp_mngr).internal + uVar1);
    if (uVar1 == 1) {
      prVar2 = prVar3;
    }
    mem_alloc.mp_mngr.internal = (alloc_ptr_t)(alloc_ptr_t)((long)prVar2 - (long)&mem_alloc);
    if (prVar2 == (rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>
                   *)0x0) {
      mem_alloc.mp_mngr.internal = (alloc_ptr_t)(alloc_ptr_t)1;
    }
    local_10.m_offset = (long)p - (long)&local_10;
    if (p == (void *)0x0) {
      local_10.m_offset = 1;
    }
    prVar2 = (rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>
              *)((long)&mem_alloc.mp_mngr.internal + (long)mem_alloc.mp_mngr.internal);
    if (mem_alloc.mp_mngr.internal == (offset_ptr_internal<unsigned_long,_0UL>)0x1) {
      prVar2 = prVar3;
    }
    addr = (rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>
            *)((long)&local_10 + local_10.m_offset);
    if (local_10.m_offset == 1) {
      addr = prVar3;
    }
    boost::interprocess::
    rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>
    ::deallocate(prVar2,addr);
    return;
  }
  __assert_fail("n && \"n must be positive\"",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0x106f,
                "void phmap::priv::Deallocate(Alloc *, void *, size_t) [Alignment = 8UL, Alloc = boost::interprocess::allocator<std::pair<const unsigned long, LatpLon>, boost::interprocess::segment_manager<char, boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family>, boost::interprocess::iset_index>>]"
               );
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  AT::deallocate(mem_alloc, static_cast<M*>(p),
                 (n + sizeof(M) - 1) / sizeof(M));
}